

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::addSyntaxTree
          (Compilation *this,shared_ptr<slang::syntax::SyntaxTree> *tree)

{
  size_t *psVar1;
  pointer *pppCVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  TokenKind TVar5;
  undefined4 uVar6;
  SyntaxNode *pSVar7;
  SyntaxNode *pSVar8;
  RootSymbol *pRVar9;
  iterator __position;
  group_type_pointer pgVar10;
  value_type_pointer pbVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  ushort uVar14;
  UnconnectedDrive UVar15;
  Compilation *pCVar16;
  SyntaxTree *pSVar17;
  size_t __n;
  char *__s1;
  value_type_pointer ppVar18;
  bool bVar19;
  byte bVar20;
  int iVar21;
  uint uVar22;
  element_type *peVar23;
  SyntaxNode *pSVar24;
  ulong uVar25;
  char_pointer puVar26;
  value_type_pointer ppVar27;
  char_pointer puVar28;
  logic_error *this_00;
  char_pointer puVar29;
  ulong uVar30;
  char_pointer puVar31;
  code *pcVar32;
  char_pointer puVar33;
  char_pointer puVar34;
  NetType *pNVar35;
  EVP_PKEY_CTX *ctx;
  undefined *puVar36;
  ulong uVar37;
  group_type_pointer pgVar38;
  ulong hash;
  long lVar39;
  table_element_pointer ppVar40;
  Compilation *pCVar41;
  NetType *pos0;
  size_type __rlen;
  basic_string_view<char,_std::char_traits<char>_> *sv;
  table_element_pointer pbVar42;
  long lVar43;
  uchar uVar44;
  uchar uVar51;
  uchar uVar52;
  byte bVar53;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  byte bVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  byte bVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  uchar uVar69;
  byte bVar70;
  undefined1 auVar54 [16];
  iterator iVar71;
  iterator iVar72;
  size_t pos;
  CompilationUnitSymbol *unit;
  locator res;
  value_type *elements;
  try_emplace_args_t local_111;
  Compilation *local_110;
  group_type_pointer local_108;
  ulong local_100;
  NetType *local_f8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
  *local_f0;
  ulong local_e8;
  EVP_PKEY_CTX *local_e0;
  undefined8 local_d8;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  uchar uStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  uchar uStack_c9;
  SyntaxNode *local_c0;
  undefined8 local_b8;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  byte bStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  byte bStack_a9;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  locator local_98;
  size_t local_80;
  value_type_pointer local_78;
  NetType *local_70;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  peVar23 = (tree->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_e0 = (EVP_PKEY_CTX *)tree;
  if (peVar23 == (element_type *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this_00,"tree cannot be null");
    puVar36 = &std::invalid_argument::typeinfo;
    pcVar32 = std::invalid_argument::~invalid_argument;
  }
  else {
    if (this->finalized == true) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"The compilation has already been finalized");
    }
    else {
      if (peVar23->sourceMan == this->sourceManager) {
LAB_00808e2c:
        pNVar35 = (NetType *)peVar23->library;
        local_110 = this;
        if (pNVar35 == (NetType *)0x0) {
          pNVar35 = (NetType *)this->defaultLibPtr;
        }
        else {
          local_f0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                      *)&this->libraryNameMap;
          local_a8._M_str = *(char **)&pNVar35->super_Symbol;
          local_a8._M_len = (pNVar35->super_Symbol).name._M_len;
          local_f8 = pNVar35;
          local_c0 = (SyntaxNode *)
                     hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )local_f0,&local_a8);
          __s1 = local_a8._M_str;
          __n = local_a8._M_len;
          pNVar35 = (NetType *)
                    ((ulong)local_c0 >>
                    ((byte)(this->libraryNameMap).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                           .arrays.groups_size_index & 0x3f));
          local_108 = (this->libraryNameMap).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                      .arrays.groups_;
          lVar39 = ((ulong)local_c0 & 0xff) * 4;
          uVar44 = (&UNK_0092f4ac)[lVar39];
          uVar51 = (&UNK_0092f4ad)[lVar39];
          uVar52 = (&UNK_0092f4ae)[lVar39];
          uVar55 = (&UNK_0092f4af)[lVar39];
          local_78 = (this->libraryNameMap).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                     .arrays.elements_;
          local_e8 = (ulong)((uint)local_c0 & 7);
          local_80 = (this->libraryNameMap).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                     .arrays.groups_size_mask;
          uVar37 = 0;
          uVar56 = uVar44;
          uVar57 = uVar51;
          uVar58 = uVar52;
          uVar59 = uVar55;
          uVar61 = uVar44;
          uVar62 = uVar51;
          uVar63 = uVar52;
          uVar64 = uVar55;
          uVar66 = uVar44;
          uVar67 = uVar51;
          uVar68 = uVar52;
          uVar69 = uVar55;
          local_70 = pNVar35;
          do {
            ppVar18 = local_78;
            pgVar38 = local_108 + (long)pNVar35;
            local_48 = pgVar38->m[0].n;
            uStack_47 = pgVar38->m[1].n;
            uStack_46 = pgVar38->m[2].n;
            uStack_45 = pgVar38->m[3].n;
            uStack_44 = pgVar38->m[4].n;
            uStack_43 = pgVar38->m[5].n;
            uStack_42 = pgVar38->m[6].n;
            uStack_41 = pgVar38->m[7].n;
            uStack_40 = pgVar38->m[8].n;
            uStack_3f = pgVar38->m[9].n;
            uStack_3e = pgVar38->m[10].n;
            uStack_3d = pgVar38->m[0xb].n;
            uStack_3c = pgVar38->m[0xc].n;
            uStack_3b = pgVar38->m[0xd].n;
            uStack_3a = pgVar38->m[0xe].n;
            uStack_39 = pgVar38->m[0xf].n;
            auVar45[0] = -(local_48 == uVar44);
            auVar45[1] = -(uStack_47 == uVar51);
            auVar45[2] = -(uStack_46 == uVar52);
            auVar45[3] = -(uStack_45 == uVar55);
            auVar45[4] = -(uStack_44 == uVar56);
            auVar45[5] = -(uStack_43 == uVar57);
            auVar45[6] = -(uStack_42 == uVar58);
            auVar45[7] = -(uStack_41 == uVar59);
            auVar45[8] = -(uStack_40 == uVar61);
            auVar45[9] = -(uStack_3f == uVar62);
            auVar45[10] = -(uStack_3e == uVar63);
            auVar45[0xb] = -(uStack_3d == uVar64);
            auVar45[0xc] = -(uStack_3c == uVar66);
            auVar45[0xd] = -(uStack_3b == uVar67);
            auVar45[0xe] = -(uStack_3a == uVar68);
            auVar45[0xf] = -(uStack_39 == uVar69);
            local_100 = CONCAT71(local_100._1_7_,uStack_39);
            uVar22 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
            local_b8 = pNVar35;
            if (uVar22 != 0) {
              local_d8 = (SyntaxTree *)
                         CONCAT17(uVar59,CONCAT16(uVar58,CONCAT15(uVar57,CONCAT14(uVar56,CONCAT13(
                                                  uVar55,CONCAT12(uVar52,CONCAT11(uVar51,uVar44)))))
                                                 ));
              uStack_d0 = uVar61;
              uStack_cf = uVar62;
              uStack_ce = uVar63;
              uStack_cd = uVar64;
              uStack_cc = uVar66;
              uStack_cb = uVar67;
              uStack_ca = uVar68;
              uStack_c9 = uVar69;
              do {
                uVar12 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                uVar25 = (ulong)uVar12;
                if (__n == ppVar18[(long)pNVar35 * 0xf + uVar25].first._M_len) {
                  ppVar27 = (value_type_pointer)(ppVar18 + (long)pNVar35 * 0xf + uVar25);
                  if (__n == 0) goto LAB_00809016;
                  iVar21 = bcmp(__s1,ppVar18[(long)pNVar35 * 0xf + uVar25].first._M_str,__n);
                  uVar44 = (uchar)local_d8;
                  uVar51 = local_d8._1_1_;
                  uVar52 = local_d8._2_1_;
                  uVar55 = local_d8._3_1_;
                  uVar56 = local_d8._4_1_;
                  uVar57 = local_d8._5_1_;
                  uVar58 = local_d8._6_1_;
                  uVar59 = local_d8._7_1_;
                  uVar61 = uStack_d0;
                  uVar62 = uStack_cf;
                  uVar63 = uStack_ce;
                  uVar64 = uStack_cd;
                  uVar66 = uStack_cc;
                  uVar67 = uStack_cb;
                  uVar68 = uStack_ca;
                  uVar69 = uStack_c9;
                  if (iVar21 == 0) goto LAB_00809016;
                }
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
            }
            pCVar41 = local_110;
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[local_e8] & (byte)local_100) == 0)
            break;
            lVar39 = uVar37 + 1;
            uVar37 = uVar37 + 1;
            pNVar35 = (NetType *)((long)&(local_b8->super_Symbol).kind + lVar39 & local_80);
          } while (uVar37 <= local_80);
          if ((local_110->libraryNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
              .size_ctrl.size <
              (local_110->libraryNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                      ((locator *)&local_98,local_f0,(arrays_type *)local_f0,(size_t)local_70,
                       (size_t)local_c0,&local_111,&local_a8);
            psVar1 = &(pCVar41->libraryNameMap).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                      .size_ctrl.size;
            *psVar1 = *psVar1 + 1;
            ppVar27 = local_98.p;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                      ((locator *)&local_98,local_f0,(size_t)local_c0,&local_111,&local_a8);
            ppVar27 = local_98.p;
          }
LAB_00809016:
          (ppVar27->second).defaultNetType = local_f8;
          peVar23 = *(element_type **)local_e0;
          pNVar35 = local_f8;
        }
        pCVar41 = local_110;
        pSVar7 = peVar23->rootNode;
        pSVar8 = pSVar7;
        do {
          pSVar24 = pSVar8;
          pSVar8 = pSVar24->parent;
        } while (pSVar8 != (SyntaxNode *)0x0);
        local_a8._M_len =
             (size_t)BumpAllocator::
                     emplace<slang::ast::CompilationUnitSymbol,slang::ast::Compilation&,slang::SourceLibrary_const&>
                               (&local_110->super_BumpAllocator,local_110,(SourceLibrary *)pNVar35);
        (((CompilationUnitSymbol *)local_a8._M_len)->super_Symbol).originatingSyntax = pSVar24;
        pRVar9 = (pCVar41->root)._M_t.
                 super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                 .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        Scope::insertMember(&pRVar9->super_Scope,(Symbol *)local_a8._M_len,
                            (pRVar9->super_Scope).lastMember,false,true);
        __position._M_current =
             (pCVar41->compilationUnits).
             super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_c0 = pSVar7;
        if (__position._M_current ==
            (pCVar41->compilationUnits).
            super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<slang::ast::CompilationUnitSymbol_const*,std::allocator<slang::ast::CompilationUnitSymbol_const*>>
          ::_M_realloc_insert<slang::ast::CompilationUnitSymbol_const*const&>
                    ((vector<slang::ast::CompilationUnitSymbol_const*,std::allocator<slang::ast::CompilationUnitSymbol_const*>>
                      *)&pCVar41->compilationUnits,__position,(CompilationUnitSymbol **)&local_a8);
        }
        else {
          *__position._M_current = (CompilationUnitSymbol *)local_a8._M_len;
          pppCVar2 = &(pCVar41->compilationUnits).
                      super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar2 = *pppCVar2 + 1;
        }
        iVar71 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                 ::begin(*(table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                           **)(*(long *)local_e0 + 0x158));
        if (iVar71.p_ != (table_element_pointer)0x0) {
          local_f0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                      *)&pCVar41->syntaxMetadata;
LAB_00809394:
          do {
            ppVar40 = iVar71.p_;
            local_d8 = *(SyntaxTree **)local_e0;
            local_b8 = getNetType(pCVar41,(ppVar40->second).defaultNetType);
            pCVar16 = local_110;
            local_f8 = (NetType *)
                       CONCAT44(local_f8._4_4_,
                                (ppVar40->second).timeScale.
                                super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                                super__Optional_payload_base<slang::TimeScale>._M_payload);
            TVar5 = (ppVar40->second).unconnectedDrive;
            UVar15 = (uint)(TVar5 == Pull1Keyword) * 2;
            if (TVar5 == Pull0Keyword) {
              UVar15 = Pull0;
            }
            auVar13._8_8_ = 0;
            auVar13._0_8_ = ppVar40->first;
            hash = SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar25 = hash >> ((byte)(pCVar41->syntaxMetadata).table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                                    .arrays.groups_size_index & 0x3f);
            local_100 = CONCAT71(local_100._1_7_,
                                 (ppVar40->second).timeScale.
                                 super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                                 super__Optional_payload_base<slang::TimeScale>._M_engaged);
            local_108 = (group_type_pointer)CONCAT71(local_108._1_7_,(ppVar40->second).cellDefine);
            uVar6 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[hash & 0xff];
            ppVar27 = (pCVar41->syntaxMetadata).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                      .arrays.elements_;
            local_e8 = (pCVar41->syntaxMetadata).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                       .arrays.groups_size_mask;
            uVar30 = 0;
            uVar37 = uVar25;
            do {
              pgVar4 = (pCVar41->syntaxMetadata).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                       .arrays.groups_ + uVar37;
              local_58 = pgVar4->m[0].n;
              uStack_57 = pgVar4->m[1].n;
              uStack_56 = pgVar4->m[2].n;
              bStack_55 = pgVar4->m[3].n;
              uStack_54 = pgVar4->m[4].n;
              uStack_53 = pgVar4->m[5].n;
              uStack_52 = pgVar4->m[6].n;
              bStack_51 = pgVar4->m[7].n;
              uStack_50 = pgVar4->m[8].n;
              uStack_4f = pgVar4->m[9].n;
              uStack_4e = pgVar4->m[10].n;
              bStack_4d = pgVar4->m[0xb].n;
              uStack_4c = pgVar4->m[0xc].n;
              uStack_4b = pgVar4->m[0xd].n;
              uStack_4a = pgVar4->m[0xe].n;
              bStack_49 = pgVar4->m[0xf].n;
              uVar44 = (uchar)uVar6;
              auVar54[0] = -(local_58 == uVar44);
              uVar51 = (uchar)((uint)uVar6 >> 8);
              auVar54[1] = -(uStack_57 == uVar51);
              uVar52 = (uchar)((uint)uVar6 >> 0x10);
              auVar54[2] = -(uStack_56 == uVar52);
              bVar53 = (byte)((uint)uVar6 >> 0x18);
              auVar54[3] = -(bStack_55 == bVar53);
              auVar54[4] = -(uStack_54 == uVar44);
              auVar54[5] = -(uStack_53 == uVar51);
              auVar54[6] = -(uStack_52 == uVar52);
              auVar54[7] = -(bStack_51 == bVar53);
              auVar54[8] = -(uStack_50 == uVar44);
              auVar54[9] = -(uStack_4f == uVar51);
              auVar54[10] = -(uStack_4e == uVar52);
              auVar54[0xb] = -(bStack_4d == bVar53);
              auVar54[0xc] = -(uStack_4c == uVar44);
              auVar54[0xd] = -(uStack_4b == uVar51);
              auVar54[0xe] = -(uStack_4a == uVar52);
              auVar54[0xf] = -(bStack_49 == bVar53);
              for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe);
                  uVar22 != 0; uVar22 = uVar22 - 1 & uVar22) {
                uVar12 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                if (ppVar40->first == ppVar27[uVar37 * 0xf + (ulong)uVar12].first) {
                  ppVar27 = ppVar27 + uVar37 * 0xf + (ulong)uVar12;
                  goto LAB_0080952d;
                }
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0)
              break;
              lVar39 = uVar37 + uVar30;
              uVar30 = uVar30 + 1;
              uVar37 = lVar39 + 1U & local_e8;
            } while (uVar30 <= local_e8);
            if ((local_110->syntaxMetadata).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                .size_ctrl.size <
                (local_110->syntaxMetadata).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*const&>
                        (&local_98,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                          *)local_f0,(arrays_type *)local_f0,uVar25,hash,&local_111,&ppVar40->first)
              ;
              psVar1 = &(pCVar16->syntaxMetadata).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                        .size_ctrl.size;
              *psVar1 = *psVar1 + 1;
              ppVar27 = local_98.p;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*const&>
                        (&local_98,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                          *)local_f0,hash,&local_111,&ppVar40->first);
              ppVar27 = local_98.p;
            }
LAB_0080952d:
            (ppVar27->second).tree = local_d8;
            (ppVar27->second).defaultNetType = local_b8;
            (ppVar27->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload = local_f8._0_4_;
            (ppVar27->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged =
                 (bool)(byte)local_100;
            *(undefined2 *)&(ppVar27->second).field_0x15 = local_98.pg._0_2_;
            (ppVar27->second).field_0x17 = local_98.pg._2_1_;
            (ppVar27->second).unconnectedDrive = UVar15;
            (ppVar27->second).cellDefine = local_108._0_1_;
            puVar31 = iVar71.pc_ + 0x12;
            puVar34 = iVar71.pc_ + 2;
LAB_0080957f:
            puVar28 = puVar34;
            puVar34 = iVar71.pc_;
            ppVar40 = iVar71.p_ + 1;
            pCVar41 = pCVar16;
            if (((uint)iVar71.pc_ & 0xf) != 0xe) goto code_r0x0080958d;
            auVar49[0] = -(*puVar28 == '\0');
            auVar49[1] = -(puVar28[1] == '\0');
            auVar49[2] = -(puVar28[2] == '\0');
            auVar49[3] = -(puVar28[3] == '\0');
            auVar49[4] = -(puVar28[4] == '\0');
            auVar49[5] = -(puVar28[5] == '\0');
            auVar49[6] = -(puVar28[6] == '\0');
            auVar49[7] = -(puVar28[7] == '\0');
            auVar49[8] = -(puVar28[8] == '\0');
            auVar49[9] = -(puVar28[9] == '\0');
            auVar49[10] = -(puVar28[10] == '\0');
            auVar49[0xb] = -(puVar28[0xb] == '\0');
            auVar49[0xc] = -(puVar28[0xc] == '\0');
            auVar49[0xd] = -(puVar28[0xd] == '\0');
            auVar49[0xe] = -(puVar28[0xe] == '\0');
            auVar49[0xf] = -(puVar28[0xf] == '\0');
            uVar14 = (ushort)(SUB161(auVar49 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe;
            while (uVar14 == 0x7fff) {
              ppVar40 = ppVar40 + 0xf;
              auVar50[0] = -(*puVar31 == '\0');
              auVar50[1] = -(puVar31[1] == '\0');
              auVar50[2] = -(puVar31[2] == '\0');
              auVar50[3] = -(puVar31[3] == '\0');
              auVar50[4] = -(puVar31[4] == '\0');
              auVar50[5] = -(puVar31[5] == '\0');
              auVar50[6] = -(puVar31[6] == '\0');
              auVar50[7] = -(puVar31[7] == '\0');
              auVar50[8] = -(puVar31[8] == '\0');
              auVar50[9] = -(puVar31[9] == '\0');
              auVar50[10] = -(puVar31[10] == '\0');
              auVar50[0xb] = -(puVar31[0xb] == '\0');
              auVar50[0xc] = -(puVar31[0xc] == '\0');
              auVar50[0xd] = -(puVar31[0xd] == '\0');
              auVar50[0xe] = -(puVar31[0xe] == '\0');
              auVar50[0xf] = -(puVar31[0xf] == '\0');
              puVar28 = puVar31;
              puVar31 = puVar31 + 0x10;
              uVar14 = (ushort)(SUB161(auVar50 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe;
            }
            uVar22 = 0;
            if ((uVar14 ^ 0x7fff) != 0) {
              for (; ((uVar14 ^ 0x7fff) >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            if (puVar28[uVar22] == '\x01') break;
            iVar71.p_ = ppVar40 + uVar22;
            iVar71.pc_ = puVar28 + uVar22;
          } while( true );
        }
LAB_008090d0:
        iVar72 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::begin((table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)(*(long *)(*(long *)local_e0 + 0x158) + 0x30));
        if (iVar72.p_ != (table_element_pointer)0x0) {
          local_d8 = (SyntaxTree *)&local_110->globalInstantiations;
LAB_00809107:
          do {
            pSVar17 = local_d8;
            sv = iVar72.p_;
            uVar25 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )local_d8,sv);
            pos0 = (NetType *)(uVar25 >> (pSVar17->isLibraryUnit & 0x3fU));
            lVar39 = (uVar25 & 0xff) * 4;
            uVar44 = (&UNK_0092f4ac)[lVar39];
            uVar51 = (&UNK_0092f4ad)[lVar39];
            uVar52 = (&UNK_0092f4ae)[lVar39];
            bVar53 = (&UNK_0092f4af)[lVar39];
            pgVar38 = (group_type_pointer)(ulong)((uint)uVar25 & 7);
            uVar37 = 0;
            pNVar35 = pos0;
            uVar55 = uVar44;
            uVar56 = uVar51;
            uVar57 = uVar52;
            bVar60 = bVar53;
            uVar58 = uVar44;
            uVar59 = uVar51;
            uVar61 = uVar52;
            bVar65 = bVar53;
            uVar62 = uVar44;
            uVar63 = uVar51;
            uVar64 = uVar52;
            bVar70 = bVar53;
            do {
              pgVar10 = (local_110->globalInstantiations).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                        .arrays.groups_;
              pgVar3 = pgVar10 + (long)pNVar35;
              local_68 = pgVar3->m[0].n;
              uStack_67 = pgVar3->m[1].n;
              uStack_66 = pgVar3->m[2].n;
              bStack_65 = pgVar3->m[3].n;
              uStack_64 = pgVar3->m[4].n;
              uStack_63 = pgVar3->m[5].n;
              uStack_62 = pgVar3->m[6].n;
              bStack_61 = pgVar3->m[7].n;
              uStack_60 = pgVar3->m[8].n;
              uStack_5f = pgVar3->m[9].n;
              uStack_5e = pgVar3->m[10].n;
              bStack_5d = pgVar3->m[0xb].n;
              uStack_5c = pgVar3->m[0xc].n;
              uStack_5b = pgVar3->m[0xd].n;
              uStack_5a = pgVar3->m[0xe].n;
              bVar20 = pgVar3->m[0xf].n;
              auVar46[0] = -(local_68 == uVar44);
              auVar46[1] = -(uStack_67 == uVar51);
              auVar46[2] = -(uStack_66 == uVar52);
              auVar46[3] = -(bStack_65 == bVar53);
              auVar46[4] = -(uStack_64 == uVar55);
              auVar46[5] = -(uStack_63 == uVar56);
              auVar46[6] = -(uStack_62 == uVar57);
              auVar46[7] = -(bStack_61 == bVar60);
              auVar46[8] = -(uStack_60 == uVar58);
              auVar46[9] = -(uStack_5f == uVar59);
              auVar46[10] = -(uStack_5e == uVar61);
              auVar46[0xb] = -(bStack_5d == bVar65);
              auVar46[0xc] = -(uStack_5c == uVar62);
              auVar46[0xd] = -(uStack_5b == uVar63);
              auVar46[0xe] = -(uStack_5a == uVar64);
              auVar46[0xf] = -(bVar20 == bVar70);
              uVar22 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
              bStack_59 = bVar20;
              if (uVar22 != 0) {
                local_b8 = (NetType *)
                           CONCAT17(bVar60,CONCAT16(uVar57,CONCAT15(uVar56,CONCAT14(uVar55,CONCAT13(
                                                  bVar53,CONCAT12(uVar52,CONCAT11(uVar51,uVar44)))))
                                                  ));
                pbVar11 = (local_110->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.elements_;
                local_108 = pgVar38;
                local_100 = uVar37;
                local_f8 = pNVar35;
                local_e8 = uVar25;
                uStack_b0 = uVar58;
                uStack_af = uVar59;
                uStack_ae = uVar61;
                bStack_ad = bVar65;
                uStack_ac = uVar62;
                uStack_ab = uVar63;
                uStack_aa = uVar64;
                bStack_a9 = bVar70;
                do {
                  iVar21 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> iVar21 & 1) == 0; iVar21 = iVar21 + 1) {
                    }
                  }
                  bVar19 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)local_d8,sv,
                                      (basic_string_view<char,_std::char_traits<char>_> *)
                                      ((long)&pbVar11[(long)pNVar35 * 0xf]._M_len +
                                      (ulong)(uint)(iVar21 << 4)));
                  if (bVar19) goto LAB_0080926d;
                  uVar22 = uVar22 - 1 & uVar22;
                } while (uVar22 != 0);
                bVar20 = pgVar10[(long)pNVar35].m[0xf].n;
                pNVar35 = local_f8;
                uVar37 = local_100;
                pgVar38 = local_108;
                uVar25 = local_e8;
                uVar44 = (uchar)local_b8;
                uVar51 = local_b8._1_1_;
                uVar52 = local_b8._2_1_;
                bVar53 = local_b8._3_1_;
                uVar55 = local_b8._4_1_;
                uVar56 = local_b8._5_1_;
                uVar57 = local_b8._6_1_;
                bVar60 = local_b8._7_1_;
                uVar58 = uStack_b0;
                uVar59 = uStack_af;
                uVar61 = uStack_ae;
                bVar65 = bStack_ad;
                uVar62 = uStack_ac;
                uVar63 = uStack_ab;
                uVar64 = uStack_aa;
                bVar70 = bStack_a9;
              }
              pCVar41 = local_110;
              if ((pgVar38[0x92f8a].m[0].n & bVar20) == 0) break;
              uVar30 = (local_110->globalInstantiations).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.groups_size_mask;
              lVar39 = uVar37 + 1;
              uVar37 = uVar37 + 1;
              pNVar35 = (NetType *)
                        ((long)&((_Alloc_hider *)&(pNVar35->super_Symbol).kind)->_M_p + lVar39 &
                        uVar30);
            } while (uVar37 <= uVar30);
            if ((local_110->globalInstantiations).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.size <
                (local_110->globalInstantiations).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::
              nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>const&>
                        ((locator *)&local_98,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)local_d8,(arrays_type *)local_d8,(size_t)pos0,uVar25,sv);
              psVar1 = &(pCVar41->globalInstantiations).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                        .size_ctrl.size;
              *psVar1 = *psVar1 + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::
              unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>const&>
                        ((locator *)&local_98,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)local_d8,uVar25,sv);
            }
LAB_0080926d:
            puVar29 = iVar72.pc_ + 0x12;
            puVar33 = iVar72.pc_ + 2;
            while( true ) {
              puVar26 = puVar33;
              puVar33 = iVar72.pc_;
              pbVar42 = iVar72.p_ + 1;
              if (((uint)iVar72.pc_ & 0xf) == 0xe) break;
              iVar72.p_ = pbVar42;
              iVar72.pc_ = puVar33 + 1;
              puVar29 = puVar29 + 1;
              puVar33 = puVar26 + 1;
              if (puVar26[-1] != '\0') goto code_r0x0080929b;
            }
            auVar47[0] = -(*puVar26 == '\0');
            auVar47[1] = -(puVar26[1] == '\0');
            auVar47[2] = -(puVar26[2] == '\0');
            auVar47[3] = -(puVar26[3] == '\0');
            auVar47[4] = -(puVar26[4] == '\0');
            auVar47[5] = -(puVar26[5] == '\0');
            auVar47[6] = -(puVar26[6] == '\0');
            auVar47[7] = -(puVar26[7] == '\0');
            auVar47[8] = -(puVar26[8] == '\0');
            auVar47[9] = -(puVar26[9] == '\0');
            auVar47[10] = -(puVar26[10] == '\0');
            auVar47[0xb] = -(puVar26[0xb] == '\0');
            auVar47[0xc] = -(puVar26[0xc] == '\0');
            auVar47[0xd] = -(puVar26[0xd] == '\0');
            auVar47[0xe] = -(puVar26[0xe] == '\0');
            auVar47[0xf] = -(puVar26[0xf] == '\0');
            uVar14 = (ushort)(SUB161(auVar47 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe;
            while (uVar14 == 0x7fff) {
              pbVar42 = pbVar42 + 0xf;
              auVar48[0] = -(*puVar29 == '\0');
              auVar48[1] = -(puVar29[1] == '\0');
              auVar48[2] = -(puVar29[2] == '\0');
              auVar48[3] = -(puVar29[3] == '\0');
              auVar48[4] = -(puVar29[4] == '\0');
              auVar48[5] = -(puVar29[5] == '\0');
              auVar48[6] = -(puVar29[6] == '\0');
              auVar48[7] = -(puVar29[7] == '\0');
              auVar48[8] = -(puVar29[8] == '\0');
              auVar48[9] = -(puVar29[9] == '\0');
              auVar48[10] = -(puVar29[10] == '\0');
              auVar48[0xb] = -(puVar29[0xb] == '\0');
              auVar48[0xc] = -(puVar29[0xc] == '\0');
              auVar48[0xd] = -(puVar29[0xd] == '\0');
              auVar48[0xe] = -(puVar29[0xe] == '\0');
              auVar48[0xf] = -(puVar29[0xf] == '\0');
              puVar26 = puVar29;
              puVar29 = puVar29 + 0x10;
              uVar14 = (ushort)(SUB161(auVar48 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe;
            }
            uVar22 = 0;
            if ((uVar14 ^ 0x7fff) != 0) {
              for (; ((uVar14 ^ 0x7fff) >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            if (puVar26[uVar22] == '\x01') break;
            iVar72.p_ = (table_element_pointer)((long)&pbVar42->_M_len + (ulong)(uVar22 << 4));
            iVar72.pc_ = puVar26 + uVar22;
          } while( true );
        }
LAB_0080932b:
        pCVar41 = local_110;
        if (local_c0->kind == CompilationUnit) {
          lVar39 = *(long *)(local_c0 + 3);
          if (lVar39 != 0) {
            pSVar7 = local_c0[2].previewNode;
            lVar43 = 0;
            do {
              CompilationUnitSymbol::addMembers
                        ((CompilationUnitSymbol *)local_a8._M_len,
                         *(SyntaxNode **)((long)&pSVar7->kind + lVar43));
              lVar43 = lVar43 + 8;
            } while (lVar39 << 3 != lVar43);
          }
        }
        else if (local_c0->kind == LibraryMap) {
          lVar39 = *(long *)(local_c0 + 3);
          if (lVar39 != 0) {
            pSVar7 = local_c0[2].previewNode;
            lVar43 = 0;
            do {
              CompilationUnitSymbol::addMembers
                        ((CompilationUnitSymbol *)local_a8._M_len,
                         *(SyntaxNode **)((long)&pSVar7->kind + lVar43));
              lVar43 = lVar43 + 8;
            } while (lVar39 << 3 != lVar43);
          }
        }
        else {
          CompilationUnitSymbol::addMembers((CompilationUnitSymbol *)local_a8._M_len,local_c0);
          pCVar41 = local_110;
        }
        ctx = local_e0;
        std::
        vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
        ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>
                  ((vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
                    *)&pCVar41->syntaxTrees,(shared_ptr<slang::syntax::SyntaxTree> *)local_e0);
        if ((pCVar41->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>
            ._M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
            super__Optional_payload_base<slang::Diagnostics>._M_engaged == true) {
          (pCVar41->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
          _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
          super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
          SmallVectorBase<slang::Diagnostic>::cleanup
                    ((SmallVectorBase<slang::Diagnostic> *)&pCVar41->cachedParseDiagnostics,ctx);
        }
        return;
      }
      if (this->sourceManager == (SourceManager *)0x0) {
        this->sourceManager = peVar23->sourceMan;
        goto LAB_00808e2c;
      }
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,
                 "All syntax trees added to the compilation must use the same source manager");
    }
    puVar36 = &std::logic_error::typeinfo;
    pcVar32 = std::logic_error::~logic_error;
  }
  __cxa_throw(this_00,puVar36,pcVar32);
code_r0x0080958d:
  iVar71.p_ = ppVar40;
  iVar71.pc_ = puVar34 + 1;
  puVar31 = puVar31 + 1;
  puVar34 = puVar28 + 1;
  if (puVar28[-1] != '\0') goto code_r0x0080959e;
  goto LAB_0080957f;
code_r0x0080959e:
  if (puVar28[-1] == '\x01') goto LAB_008090d0;
  iVar71.pc_ = puVar28 + -1;
  goto LAB_00809394;
code_r0x0080929b:
  if (puVar26[-1] != '\x01') {
    iVar72.pc_ = puVar26 + -1;
    goto LAB_00809107;
  }
  goto LAB_0080932b;
}

Assistant:

void Compilation::addSyntaxTree(std::shared_ptr<SyntaxTree> tree) {
    SLANG_ASSERT(!isFrozen());

    if (!tree)
        SLANG_THROW(std::invalid_argument("tree cannot be null"));

    if (finalized)
        SLANG_THROW(std::logic_error("The compilation has already been finalized"));

    if (&tree->sourceManager() != sourceManager) {
        if (!sourceManager)
            sourceManager = &tree->sourceManager();
        else {
            SLANG_THROW(std::logic_error(
                "All syntax trees added to the compilation must use the same source manager"));
        }
    }

    auto lib = tree->getSourceLibrary();
    if (lib) {
        auto& entry = libraryNameMap[lib->name];
        SLANG_ASSERT(entry == nullptr || entry == lib);
        entry = lib;
    }
    else {
        lib = defaultLibPtr;
    }

    const SyntaxNode& node = tree->root();
    const SyntaxNode* topNode = &node;
    while (topNode->parent)
        topNode = topNode->parent;

    auto unit = emplace<CompilationUnitSymbol>(*this, *lib);
    unit->setSyntax(*topNode);
    root->addMember(*unit);
    compilationUnits.push_back(unit);

    for (auto& [n, meta] : tree->getMetadata().nodeMap) {
        SyntaxMetadata result;
        result.tree = tree.get();
        result.defaultNetType = &getNetType(meta.defaultNetType);
        result.timeScale = meta.timeScale;

        switch (meta.unconnectedDrive) {
            case TokenKind::Pull0Keyword:
                result.unconnectedDrive = UnconnectedDrive::Pull0;
                break;
            case TokenKind::Pull1Keyword:
                result.unconnectedDrive = UnconnectedDrive::Pull1;
                break;
            default:
                result.unconnectedDrive = UnconnectedDrive::None;
                break;
        }

        result.cellDefine = meta.cellDefine;

        syntaxMetadata[n] = result;
    }

    for (auto& name : tree->getMetadata().globalInstances)
        globalInstantiations.emplace(name);

    if (node.kind == SyntaxKind::CompilationUnit) {
        for (auto member : node.as<CompilationUnitSyntax>().members)
            unit->addMembers(*member);
    }
    else if (node.kind == SyntaxKind::LibraryMap) {
        for (auto member : node.as<LibraryMapSyntax>().members)
            unit->addMembers(*member);
    }
    else {
        unit->addMembers(node);
    }

    syntaxTrees.emplace_back(std::move(tree));
    cachedParseDiagnostics.reset();
}